

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O3

bool ContainsData(ScopeData *scope,bool checkImported)

{
  TypeBase *pTVar1;
  ScopeData **ppSVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar4 = (ulong)(scope->types).count;
  if (uVar4 != 0) {
    uVar3 = 0;
    do {
      pTVar1 = (scope->types).data[uVar3];
      bVar5 = false;
      if ((pTVar1 != (TypeBase *)0x0) && (pTVar1->typeID == 0x18)) {
        bVar5 = pTVar1->importModule != (ModuleData *)0x0;
      }
      if (bVar5 == checkImported) {
        return true;
      }
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  uVar4 = (ulong)(scope->functions).count;
  if (uVar4 != 0) {
    uVar3 = 0;
    do {
      if (((scope->functions).data[uVar3]->importModule == (ModuleData *)0x0) != checkImported) {
        return true;
      }
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  if (((scope->ownerFunction == (FunctionData *)0x0) ||
      ((scope->ownerFunction->importModule == (ModuleData *)0x0) != checkImported)) &&
     (uVar4 = (ulong)(scope->variables).count, uVar4 != 0)) {
    uVar3 = 0;
    do {
      if (((scope->variables).data[uVar3]->importModule == (ModuleData *)0x0) != checkImported) {
        return true;
      }
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  uVar4 = (ulong)(scope->aliases).count;
  if (uVar4 != 0) {
    uVar3 = 0;
    do {
      if (((scope->aliases).data[uVar3]->importModule == (ModuleData *)0x0) != checkImported) {
        return true;
      }
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  if ((scope->scopes).count == 0) {
    bVar5 = false;
  }
  else {
    ppSVar2 = (scope->scopes).data;
    uVar4 = 0;
    do {
      bVar5 = ContainsData(ppSVar2[uVar4],checkImported);
      if (bVar5) {
        return bVar5;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (scope->scopes).count);
  }
  return bVar5;
}

Assistant:

bool ContainsData(ScopeData *scope, bool checkImported)
{
	for(unsigned i = 0; i < scope->types.size(); i++)
	{
		TypeBase *data = scope->types[i];

		bool imported = getType<TypeClass>(data) && getType<TypeClass>(data)->importModule != NULL;

		if(checkImported == imported)
			return true;
	}

	for(unsigned i = 0; i < scope->functions.size(); i++)
	{
		bool imported = scope->functions[i]->importModule != NULL;

		if(checkImported == imported)
			return true;
	}

	bool ownerFunctionImported = scope->ownerFunction && scope->ownerFunction->importModule != NULL;

	if(!scope->ownerFunction || checkImported == ownerFunctionImported)
	{
		for(unsigned i = 0; i < scope->variables.size(); i++)
		{
			bool imported = scope->variables[i]->importModule != NULL;

			if(checkImported == imported)
				return true;
		}
	}

	for(unsigned i = 0; i < scope->aliases.size(); i++)
	{
		bool imported = scope->aliases[i]->importModule != NULL;

		if(checkImported == imported)
			return true;
	}

	for(unsigned i = 0; i < scope->scopes.size(); i++)
	{
		if(ContainsData(scope->scopes[i], checkImported))
			return true;
	}

	return false;
}